

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3_set_auxdata(sqlite3_context *pCtx,int iArg,void *pAux,_func_void_void_ptr *xDelete)

{
  Vdbe *pVVar1;
  AuxData *pAVar2;
  
  pVVar1 = pCtx->pVdbe;
  if (pVVar1 != (Vdbe *)0x0) {
    for (pAVar2 = pVVar1->pAuxData; pAVar2 != (AuxData *)0x0; pAVar2 = pAVar2->pNextAux) {
      if ((pAVar2->iAuxArg == iArg) && ((iArg < 0 || (pAVar2->iAuxOp == pCtx->iOp)))) {
        if (pAVar2->xDeleteAux != (_func_void_void_ptr *)0x0) {
          (*pAVar2->xDeleteAux)(pAVar2->pAux);
        }
        goto LAB_00138b2e;
      }
    }
    pAVar2 = (AuxData *)sqlite3DbMallocZero(pVVar1->db,0x20);
    if (pAVar2 != (AuxData *)0x0) {
      pAVar2->iAuxOp = pCtx->iOp;
      pAVar2->iAuxArg = iArg;
      pAVar2->pNextAux = pVVar1->pAuxData;
      pVVar1->pAuxData = pAVar2;
      if (pCtx->isError == 0) {
        pCtx->isError = -1;
      }
LAB_00138b2e:
      pAVar2->pAux = pAux;
      pAVar2->xDeleteAux = xDelete;
      return;
    }
  }
  if (xDelete == (_func_void_void_ptr *)0x0) {
    return;
  }
  (*xDelete)(pAux);
  return;
}

Assistant:

SQLITE_API void sqlite3_set_auxdata(
  sqlite3_context *pCtx, 
  int iArg, 
  void *pAux, 
  void (*xDelete)(void*)
){
  AuxData *pAuxData;
  Vdbe *pVdbe = pCtx->pVdbe;

  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pVdbe==0 ) goto failed;
#else
  assert( pVdbe!=0 );
#endif

  for(pAuxData=pVdbe->pAuxData; pAuxData; pAuxData=pAuxData->pNextAux){
    if( pAuxData->iAuxArg==iArg && (pAuxData->iAuxOp==pCtx->iOp || iArg<0) ){
      break;
    }
  }
  if( pAuxData==0 ){
    pAuxData = sqlite3DbMallocZero(pVdbe->db, sizeof(AuxData));
    if( !pAuxData ) goto failed;
    pAuxData->iAuxOp = pCtx->iOp;
    pAuxData->iAuxArg = iArg;
    pAuxData->pNextAux = pVdbe->pAuxData;
    pVdbe->pAuxData = pAuxData;
    if( pCtx->isError==0 ) pCtx->isError = -1;
  }else if( pAuxData->xDeleteAux ){
    pAuxData->xDeleteAux(pAuxData->pAux);
  }

  pAuxData->pAux = pAux;
  pAuxData->xDeleteAux = xDelete;
  return;

failed:
  if( xDelete ){
    xDelete(pAux);
  }
}